

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O0

int TPZShapeHDivConstantBound<pzshape::TPZShapePoint>::ComputeNConnectShapeF(int connect,int order)

{
  MElementType MVar1;
  int in_ESI;
  int in_EDI;
  MElementType thistype;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  undefined4 local_4;
  
  MVar1 = pztopology::TPZPoint::Type();
  if (MVar1 == EOned) {
    local_4 = in_ESI + 1;
  }
  else if (MVar1 == ETriangle) {
    if (in_EDI < 0) {
      local_4 = (in_ESI * ((in_ESI + 1) * 2 + 4)) / 4 + 1;
    }
    else {
      local_4 = 0;
    }
  }
  else if (MVar1 == EQuadrilateral) {
    if (in_EDI < 0) {
      local_4 = in_ESI * (in_ESI + 2) + 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  return local_4;
}

Assistant:

int TPZShapeHDivConstantBound<TSHAPE>::ComputeNConnectShapeF(int connect, int order)
{
#ifdef DEBUG
    if (connect < 0 || connect > TSHAPE::NFacets) {
        DebugStop();
    }
#endif
    // int order = data.fHDivConnectOrders[connect];
    MElementType thistype = TSHAPE::Type();

    if(thistype == EOned)
    {
        order++;
        return order;
    }
    else if(thistype == ETriangle)
    {
        order++;
        if(connect < TSHAPE::NFacets) return 1 + (order-1)*(2*order+4)/4;
        else return 0;
    }
    else if(thistype == EQuadrilateral)
    {
        if(connect < TSHAPE::NFacets) return 1 + order*(order+2);
        else return 0;
    }

    DebugStop();
    unreachable();
 }